

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependencyKeyIDs.h
# Opt level: O2

void __thiscall
llbuild::core::DependencyKeyIDs::push_back
          (DependencyKeyIDs *this,KeyID id,bool orderOnlyFlag,bool singleUseFlag)

{
  byte local_21;
  value_type local_20;
  
  local_20._value = id._value;
  std::vector<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>::push_back
            (&this->keys,&local_20);
  local_21 = singleUseFlag * '\x02' | orderOnlyFlag;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->flags,&local_21);
  return;
}

Assistant:

void push_back(KeyID id, bool orderOnlyFlag, bool singleUseFlag) {
    keys.push_back(id);
    flags.push_back((singleUseFlag << 1) | orderOnlyFlag);
  }